

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio.c
# Opt level: O0

int archive_write_set_format_cpio(archive *_a)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  archive *in_RDI;
  int magic_test;
  cpio_conflict *cpio;
  archive_write *a;
  char *in_stack_00000078;
  uint in_stack_00000080;
  uint in_stack_00000084;
  archive *in_stack_00000088;
  int local_4;
  
  iVar2 = __archive_check_magic
                    (in_stack_00000088,in_stack_00000084,in_stack_00000080,in_stack_00000078);
  if (iVar2 == -0x1e) {
    local_4 = -0x1e;
  }
  else {
    lVar1._0_4_ = in_RDI[2].file_count;
    lVar1._4_4_ = in_RDI[2].archive_error_number;
    if (lVar1 != 0) {
      (**(code **)&in_RDI[2].file_count)(in_RDI);
    }
    pvVar3 = calloc(1,0x40);
    if (pvVar3 == (void *)0x0) {
      archive_set_error(in_RDI,0xc,"Can\'t allocate cpio data");
      local_4 = -0x1e;
    }
    else {
      *(void **)&in_RDI[1].current_codepage = pvVar3;
      in_RDI[1].sconv = (archive_string_conv *)0x1bfe0e;
      in_RDI[2].vtable = (archive_vtable_conflict *)archive_write_cpio_options;
      in_RDI[2].archive_format_name = (char *)archive_write_cpio_header;
      *(code **)&in_RDI[2].compression_code = archive_write_cpio_data;
      *(code **)&in_RDI[2].archive_format = archive_write_cpio_finish_entry;
      in_RDI[2].compression_name = (char *)archive_write_cpio_close;
      *(code **)&in_RDI[2].file_count = archive_write_cpio_free;
      in_RDI->archive_format = 0x10001;
      in_RDI->archive_format_name = "POSIX cpio";
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int
archive_write_set_format_cpio(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct cpio *cpio;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_set_format_cpio");

	/* If someone else was already registered, unregister them. */
	if (a->format_free != NULL)
		(a->format_free)(a);

	cpio = (struct cpio *)calloc(1, sizeof(*cpio));
	if (cpio == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Can't allocate cpio data");
		return (ARCHIVE_FATAL);
	}
	a->format_data = cpio;
	a->format_name = "cpio";
	a->format_options = archive_write_cpio_options;
	a->format_write_header = archive_write_cpio_header;
	a->format_write_data = archive_write_cpio_data;
	a->format_finish_entry = archive_write_cpio_finish_entry;
	a->format_close = archive_write_cpio_close;
	a->format_free = archive_write_cpio_free;
	a->archive.archive_format = ARCHIVE_FORMAT_CPIO_POSIX;
	a->archive.archive_format_name = "POSIX cpio";
	return (ARCHIVE_OK);
}